

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O2

BitMatrix *
ZXing::Inflate(BitMatrix *__return_storage_ptr__,BitMatrix *input,int width,int height,int quietZone
              )

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int outputX;
  int iVar4;
  int outputY;
  ulong uVar5;
  int inputY;
  int iVar6;
  int inputX;
  int x;
  
  iVar1 = input->_width;
  iVar6 = input->_height;
  iVar4 = iVar1 + quietZone * 2;
  if (width < iVar4) {
    width = iVar4;
  }
  iVar4 = iVar6 + quietZone * 2;
  if (height < iVar4) {
    height = iVar4;
  }
  if (iVar6 == height && iVar1 == width) {
    BitMatrix::BitMatrix(__return_storage_ptr__,input);
  }
  else {
    iVar4 = (width + quietZone * -2) / iVar1;
    iVar3 = (height + quietZone * -2) / iVar6;
    if (iVar3 < iVar4) {
      iVar4 = iVar3;
    }
    uVar5 = (long)(height - iVar6 * iVar4) / 2 & 0xffffffff;
    BitMatrix::BitMatrix(__return_storage_ptr__,width,height);
    for (iVar6 = 0; iVar6 < input->_height; iVar6 = iVar6 + 1) {
      iVar3 = (width - iVar1 * iVar4) / 2;
      for (x = 0; x < input->_width; x = x + 1) {
        bVar2 = BitMatrix::get(input,x,iVar6);
        if (bVar2) {
          BitMatrix::setRegion(__return_storage_ptr__,iVar3,(int)uVar5,iVar4,iVar4);
        }
        iVar3 = iVar3 + iVar4;
      }
      uVar5 = (ulong)(uint)((int)uVar5 + iVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BitMatrix Inflate(BitMatrix&& input, int width, int height, int quietZone)
{
	const int codeWidth = input.width();
	const int codeHeight = input.height();
	const int outputWidth = std::max(width, codeWidth + 2 * quietZone);
	const int outputHeight = std::max(height, codeHeight + 2 * quietZone);

	if (input.width() == outputWidth && input.height() == outputHeight)
		return std::move(input);

	const int scale = std::min((outputWidth - 2*quietZone) / codeWidth, (outputHeight - 2*quietZone) / codeHeight);
	// Padding includes both the quiet zone and the extra white pixels to
	// accommodate the requested dimensions.
	const int leftPadding = (outputWidth - (codeWidth * scale)) / 2;
	const int topPadding = (outputHeight - (codeHeight * scale)) / 2;

	BitMatrix result(outputWidth, outputHeight);

	for (int inputY = 0, outputY = topPadding; inputY < input.height(); ++inputY, outputY += scale) {
		for (int inputX = 0, outputX = leftPadding; inputX < input.width(); ++inputX, outputX += scale) {
			if (input.get(inputX, inputY))
				result.setRegion(outputX, outputY, scale, scale);
		}
	}

	return result;
}